

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

rrb<int,_false,_6> *
immutable::rrb_details::rrb_tail_push<int,false,6>
          (ref<immutable::rrb<int,_false,_6>_> *in,int element)

{
  rrb<int,_false,_6> *prVar1;
  rrb<int,_false,_6> *prVar2;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_20;
  
  prVar1 = rrb_head_clone<int,false,6>(in->ptr);
  prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
  local_20.ptr = leaf_node_inc<int,false>((prVar2->tail).ptr);
  (local_20.ptr)->child[prVar1->tail_len] = element;
  prVar1->cnt = prVar1->cnt + 1;
  prVar1->tail_len = prVar1->tail_len + 1;
  (local_20.ptr)->_ref_count = 1;
  ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar1->tail,&local_20);
  release<int>(local_20.ptr);
  return prVar1;
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_tail_push(const ref<rrb<T, atomic_ref_counting, N>>& in, T element)
      {
      rrb<T, atomic_ref_counting, N>* new_rrb = rrb_head_clone(in.ptr);
      leaf_node<T, atomic_ref_counting>* new_tail = leaf_node_inc(in->tail.ptr);
      new_tail->child[new_rrb->tail_len] = std::move(element);
      new_rrb->cnt++;
      new_rrb->tail_len++;
      new_rrb->tail = new_tail;
      return new_rrb;
      }